

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int shared_recover(int id)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int local_18;
  int r2;
  int r;
  int i;
  int id_local;
  
  if (shared_gt == (SHARED_GTAB *)0x0) {
    i = 0x9a;
  }
  else if (shared_lt == (SHARED_LTAB *)0x0) {
    i = 0x9a;
  }
  else {
    local_18 = 0;
    for (r2 = 0; r2 < shared_maxseg; r2 = r2 + 1) {
      if ((((id == -1) || (r2 == id)) && (shared_lt[r2].tcnt == 0)) &&
         ((shared_gt[r2].key != -1 && (iVar1 = shared_mux(r2,3), iVar1 == 0)))) {
        uVar2 = shared_process_count(shared_gt[r2].sem);
        if (((int)uVar2 < shared_gt[r2].nprocdebug) || (uVar2 == 0)) {
          if (shared_debug != 0) {
            printf("Bogus handle=%d nproc=%d sema=%d:",(ulong)(uint)r2,
                   (ulong)(uint)shared_gt[r2].nprocdebug,(ulong)uVar2);
          }
          local_18 = shared_destroy_entry(r2);
          if (shared_debug != 0) {
            pcVar3 = "handle cleared";
            if (local_18 != 0) {
              pcVar3 = "error couldn\'t clear handle";
            }
            printf("%s",pcVar3);
          }
        }
        shared_demux(r2,1);
      }
    }
    i = local_18;
  }
  return i;
}

Assistant:

int     shared_recover(int id)                  /* try to recover dormant segments after applic crash */
 { int i, r, r2;

   if (NULL == shared_gt) return(SHARED_NOTINIT);       /* not initialized */
   if (NULL == shared_lt) return(SHARED_NOTINIT);       /* not initialized */
   r = SHARED_OK;
   for (i=0; i<shared_maxseg; i++)
    { if (-1 != id) if (i != id) continue;
      if (shared_lt[i].tcnt) continue;          /* somebody (we) is using it */
      if (SHARED_INVALID == shared_gt[i].key) continue; /* unused slot */
      if (shared_mux(i, SHARED_NOWAIT | SHARED_RDWRITE)) continue; /* acquire exclusive access to segment, but do not wait */
      r2 = shared_process_count(shared_gt[i].sem);
      if ((shared_gt[i].nprocdebug > r2) || (0 == r2))
        { if (shared_debug) printf("Bogus handle=%d nproc=%d sema=%d:", i, shared_gt[i].nprocdebug, r2);
          r = shared_destroy_entry(i);
          if (shared_debug)
            { printf("%s", r ? "error couldn't clear handle" : "handle cleared");
            }
        }
      shared_demux(i, SHARED_RDWRITE);
    }
   return(r);                                           /* table full */
 }